

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::relative_pose::modules::sixpt_main
               (Matrix<double,_6,_6,_0,_6,_6> *L1,Matrix<double,_6,_6,_0,_6,_6> *L2,
               rotations_t *solutions)

{
  double dVar1;
  Scalar *pSVar2;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  complex<double> temp;
  int r;
  cayley_t solution;
  int c;
  Matrix<std::complex<double>,_64,_64,_0,_64,_64> EV;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> Eig;
  Matrix<double,_64,_64,_0,_64,_64> Action;
  int i;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L1vec;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_64,_64,_0,_64,_64>_>_>
  *in_stack_fffffffffffbf040;
  DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>,_1>
  *in_stack_fffffffffffbf048;
  Index in_stack_fffffffffffbf050;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_fffffffffffbf058;
  size_type in_stack_fffffffffffbf070;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffbf078;
  undefined8 in_stack_fffffffffffbf098;
  undefined1 computeEigenvectors;
  EigenBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *in_stack_fffffffffffbf0a0;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *in_stack_fffffffffffbf0a8;
  double dStack_40eb8;
  double dStack_40eb0;
  int iStack_40ea4;
  cayley_t *in_stack_fffffffffffbf170;
  int iStack_40e84;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *in_stack_fffffffffffbf1e0;
  int local_a8;
  
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            *)0xcf1414);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            *)0xcf1421);
  for (local_a8 = 0; computeEigenvectors = (undefined1)((ulong)in_stack_fffffffffffbf098 >> 0x38),
      local_a8 < 6; local_a8 = local_a8 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
              (in_stack_fffffffffffbf058,in_stack_fffffffffffbf050);
    Eigen::Matrix<double,6,1,0,6,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffbf048,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               in_stack_fffffffffffbf040);
    std::
    vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)in_stack_fffffffffffbf048,(value_type *)in_stack_fffffffffffbf040);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
              (in_stack_fffffffffffbf058,in_stack_fffffffffffbf050);
    Eigen::Matrix<double,6,1,0,6,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffbf048,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               in_stack_fffffffffffbf040);
    std::
    vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)in_stack_fffffffffffbf048,(value_type *)in_stack_fffffffffffbf040);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::Zero();
  Eigen::Matrix<double,64,64,0,64,64>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,64,0,64,64>>>
            ((Matrix<double,_64,_64,_0,_64,_64> *)in_stack_fffffffffffbf048,
             in_stack_fffffffffffbf040);
  sixpt::setupAction((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      *)Eig.m_realSchur.m_hess.m_matrix.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[0xedc],
                     (vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      *)Eig.m_realSchur.m_hess.m_matrix.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[0xedb],
                     (Matrix<double,_64,_64,_0,_64,_64> *)
                     Eig.m_realSchur.m_hess.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                     m_data.array[0xeda]);
  Eigen::EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>::
  EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>
            (in_stack_fffffffffffbf0a8,in_stack_fffffffffffbf0a0,(bool)computeEigenvectors);
  Eigen::EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::eigenvectors
            (in_stack_fffffffffffbf1e0);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::reserve(in_stack_fffffffffffbf078,in_stack_fffffffffffbf070);
  for (iStack_40e84 = 0; iStack_40e84 < 0x40; iStack_40e84 = iStack_40e84 + 1) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xcf15df);
    for (iStack_40ea4 = 0; iStack_40ea4 < 3; iStack_40ea4 = iStack_40ea4 + 1) {
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>,_1>::operator()
                (in_stack_fffffffffffbf048,(Index)in_stack_fffffffffffbf040,0xcf161c);
      Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>,_1>::operator()
                (in_stack_fffffffffffbf048,(Index)in_stack_fffffffffffbf040,0xcf163d);
      std::operator/((complex<double> *)in_stack_fffffffffffbf040,(complex<double> *)0xcf1653);
      dVar1 = in_XMM0_Qa;
      dStack_40eb8 = in_XMM0_Qa;
      dStack_40eb0 = in_XMM1_Qa;
      in_XMM0_Qa = std::complex<double>::real_abi_cxx11_((complex<double> *)&dStack_40eb8);
      in_XMM1_Qa = dVar1;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffbf048,(Index)in_stack_fffffffffffbf040);
      *pSVar2 = in_XMM0_Qa;
    }
    math::cayley2rot(in_stack_fffffffffffbf170);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffbf040);
    Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffbf048,
               (EigenBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffbf040);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_fffffffffffbf048,(value_type *)in_stack_fffffffffffbf040);
  }
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)in_stack_fffffffffffbf058);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)in_stack_fffffffffffbf058);
  return;
}

Assistant:

void
opengv::relative_pose::modules::sixpt_main(
  Eigen::Matrix<double,6,6> & L1,
  Eigen::Matrix<double,6,6> & L2,
  rotations_t & solutions)
{
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<double,6,1>, Eigen::aligned_allocator<Eigen::Matrix<double,6,1> > > L1vec;
  std::vector< Eigen::Matrix<double,6,1>, Eigen::aligned_allocator<Eigen::Matrix<double,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<double,64,64> Action = Eigen::Matrix<double,64,64>::Zero();
  sixpt::setupAction( L1vec, L2vec, Action );
  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<double,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<double>,64,64> EV = Eig.eigenvectors();
  
  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    cayley_t solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<double> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real();
    }
    
    solutions.push_back(math::cayley2rot(solution).transpose());
  }
}